

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2b097::CommandLineParser::addOption
          (CommandLineParser *this,Option *O,SubCommand *SC)

{
  ushort uVar1;
  bool bVar2;
  SubCommand *pSVar3;
  raw_ostream *prVar4;
  SmallVector<llvm::cl::Option_*,_4U> *this_00;
  void **ppvVar5;
  pair<llvm::StringMapIterator<llvm::cl::Option_*>,_bool> pVar6;
  SmallPtrSetIteratorImpl SVar7;
  iterator iVar8;
  Option *O_local;
  iterator __begin3;
  Option *local_38;
  
  O_local = O;
  if ((O->ArgStr).Length == 0) {
LAB_001138b3:
    bVar2 = false;
  }
  else {
    __begin3.super_SmallPtrSetIteratorImpl.Bucket = (void **)(O->ArgStr).Data;
    __begin3.super_SmallPtrSetIteratorImpl.End = (void **)(O->ArgStr).Length;
    local_38 = O;
    pVar6 = llvm::StringMap<llvm::cl::Option*,llvm::MallocAllocator>::try_emplace<llvm::cl::Option*>
                      ((StringMap<llvm::cl::Option*,llvm::MallocAllocator> *)&SC->OptionsMap,
                       (StringRef)__begin3.super_SmallPtrSetIteratorImpl,&local_38);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_001138b3;
    prVar4 = llvm::errs();
    prVar4 = llvm::raw_ostream::operator<<(prVar4,&this->ProgramName);
    prVar4 = llvm::raw_ostream::operator<<(prVar4,": CommandLine Error: Option \'");
    prVar4 = llvm::raw_ostream::operator<<(prVar4,O->ArgStr);
    llvm::raw_ostream::operator<<(prVar4,"\' registered more than once!\n");
    bVar2 = true;
  }
  uVar1 = *(ushort *)&O->field_0xc;
  if ((uVar1 & 0x180) == 0x80) {
    this_00 = &SC->PositionalOpts;
LAB_0011393c:
    llvm::SmallVectorTemplateBase<llvm::cl::Option_*,_true>::push_back
              ((SmallVectorTemplateBase<llvm::cl::Option_*,_true> *)this_00,&O_local);
  }
  else {
    if ((uVar1 >> 0xb & 1) != 0) {
      this_00 = &SC->SinkOpts;
      goto LAB_0011393c;
    }
    if ((uVar1 & 7) == 4) {
      if (SC->ConsumeAfterOpt != (Option *)0x0) {
        llvm::Twine::Twine((Twine *)&__begin3,
                           "Cannot specify more than one option with cl::ConsumeAfter!");
        prVar4 = llvm::errs();
        llvm::cl::Option::error(O,(Twine *)&__begin3,(StringRef)ZEXT816(0),prVar4);
        SC->ConsumeAfterOpt = O_local;
        goto LAB_00113a00;
      }
      SC->ConsumeAfterOpt = O;
    }
  }
  if (!bVar2) {
    pSVar3 = llvm::
             ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
             ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                          *)llvm::cl::AllSubCommands);
    if (pSVar3 == SC) {
      SVar7 = (SmallPtrSetIteratorImpl)
              llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::begin
                        (&(this->RegisteredSubCommands).
                          super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
      __begin3.super_SmallPtrSetIteratorImpl = SVar7;
      iVar8 = llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::end
                        (&(this->RegisteredSubCommands).
                          super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
      ppvVar5 = SVar7.Bucket;
      while (ppvVar5 != iVar8.super_SmallPtrSetIteratorImpl.Bucket) {
        pSVar3 = llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator*(&__begin3);
        if (pSVar3 != SC) {
          addOption(this,O_local,pSVar3);
        }
        llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator++(&__begin3);
        ppvVar5 = __begin3.super_SmallPtrSetIteratorImpl.Bucket;
      }
    }
    return;
  }
LAB_00113a00:
  llvm::report_fatal_error("inconsistency in registered CommandLine options",true);
}

Assistant:

void addOption(Option *O, SubCommand *SC) {
    bool HadErrors = false;
    if (O->hasArgStr()) {
      // Add argument to the argument map!
      if (!SC->OptionsMap.insert(std::make_pair(O->ArgStr, O)).second) {
        errs() << ProgramName << ": CommandLine Error: Option '" << O->ArgStr
               << "' registered more than once!\n";
        HadErrors = true;
      }
    }

    // Remember information about positional options.
    if (O->getFormattingFlag() == cl::Positional)
      SC->PositionalOpts.push_back(O);
    else if (O->getMiscFlags() & cl::Sink) // Remember sink options
      SC->SinkOpts.push_back(O);
    else if (O->getNumOccurrencesFlag() == cl::ConsumeAfter) {
      if (SC->ConsumeAfterOpt) {
        O->error("Cannot specify more than one option with cl::ConsumeAfter!");
        HadErrors = true;
      }
      SC->ConsumeAfterOpt = O;
    }

    // Fail hard if there were errors. These are strictly unrecoverable and
    // indicate serious issues such as conflicting option names or an
    // incorrectly
    // linked LLVM distribution.
    if (HadErrors)
      report_fatal_error("inconsistency in registered CommandLine options");

    // If we're adding this to all sub-commands, add it to the ones that have
    // already been registered.
    if (SC == &*AllSubCommands) {
      for (const auto Sub : RegisteredSubCommands) {
        if (SC == Sub)
          continue;
        addOption(O, Sub);
      }
    }
  }